

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

int __thiscall
Js::ByteCodeBufferBuilder::GetIdOfPropertyRecord
          (ByteCodeBufferBuilder *this,PropertyRecord *propertyRecord)

{
  ScriptContext *this_00;
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  int iVar4;
  PropertyRecord *propertyName;
  undefined4 *puVar5;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar6;
  ByteBuffer *this_01;
  TrackAllocData local_60;
  ByteBuffer *local_38;
  ByteBuffer *bb;
  PropertyRecord *propertyRecordCheck;
  char16 *buffer;
  size_t byteCount;
  PropertyRecord *propertyRecord_local;
  ByteCodeBufferBuilder *this_local;
  
  byteCount = (size_t)propertyRecord;
  propertyRecord_local = (PropertyRecord *)this;
  bVar2 = PropertyRecord::IsSymbol(propertyRecord);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x34b,"(!propertyRecord->IsSymbol())",
                                "bytecode serializer does not currently handle non-built-in symbol PropertyRecords"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  cVar3 = PropertyRecord::GetLength((PropertyRecord *)byteCount);
  buffer = (char16 *)(((ulong)cVar3 + 1) * 2);
  if (buffer < (char16 *)0x100000000) {
    propertyName = (PropertyRecord *)PropertyRecord::GetBuffer((PropertyRecord *)byteCount);
    this_00 = this->scriptContext;
    propertyRecordCheck = propertyName;
    cVar3 = PropertyRecord::GetLength((PropertyRecord *)byteCount);
    ScriptContext::FindPropertyRecord(this_00,(LPCWSTR)propertyName,cVar3,(PropertyRecord **)&bb);
    if (bb != (ByteBuffer *)byteCount) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                  ,0x356,"(propertyRecordCheck == propertyRecord)",
                                  "propertyRecordCheck == propertyRecord");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pAVar6 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_60,(type_info *)&ByteBuffer::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
               ,0x358);
    pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar6,&local_60);
    this_01 = (ByteBuffer *)new<Memory::ArenaAllocator>(0x10,(ArenaAllocator *)pAVar6,0x3f67b0);
    ByteBuffer::ByteBuffer(this_01,(uint32)buffer,propertyRecordCheck);
    local_38 = this_01;
    iVar4 = GetString16Id(this,this_01,true);
    return iVar4;
  }
  Throw::InternalError();
}

Assistant:

int GetIdOfPropertyRecord(const PropertyRecord * propertyRecord)
    {
        AssertMsg(!propertyRecord->IsSymbol(), "bytecode serializer does not currently handle non-built-in symbol PropertyRecords");
        size_t byteCount = ((size_t)propertyRecord->GetLength() + 1) * sizeof(char16);
        if (byteCount > UINT_MAX)
        {
            // We should never see property record that big
            Js::Throw::InternalError();
        }
        auto buffer = propertyRecord->GetBuffer();
#if DBG
        const PropertyRecord * propertyRecordCheck;
        scriptContext->FindPropertyRecord(buffer, propertyRecord->GetLength(), &propertyRecordCheck);
        Assert(propertyRecordCheck == propertyRecord);
#endif
        auto bb = Anew(alloc, ByteBuffer, (uint32)byteCount, (void*)buffer);
        return GetString16Id(bb, /*isPropertyRecord=*/ true);
    }